

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

shared_ptr<chatra::Node> __thiscall
chatra::
parseExpression<__gnu_cxx::__normal_iterator<chatra::Token_const**,std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>>>
          (chatra *this,ParserContext *ct,
          __normal_iterator<const_chatra::Token_**,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
          first,__normal_iterator<const_chatra::Token_**,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
                last)

{
  TokenType TVar1;
  Token *pTVar2;
  element_type *peVar3;
  OperatorPattern *pOVar4;
  pointer ppTVar5;
  char *pcVar6;
  bool bVar7;
  int iVar8;
  shared_ptr<chatra::Node> *psVar9;
  iterator iVar10;
  ulong uVar11;
  char *pcVar12;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  OperatorPattern *pattern;
  __normal_iterator<const_chatra::Token_**,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
  last_00;
  OperatorPattern *pOVar13;
  byte bVar14;
  __normal_iterator<const_chatra::Token_**,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
  __first;
  long lVar15;
  const_iterator __last;
  shared_ptr<chatra::Node> sVar16;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  undefined1 auStack_88 [8];
  vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_> nodes;
  undefined1 auStack_68 [8];
  shared_ptr<chatra::Node> n;
  allocator local_31;
  
  auStack_88 = (undefined1  [8])0x0;
  nodes.
  super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  nodes.
  super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __first._M_current = first._M_current;
  nodes.
  super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)ct;
  while (__first._M_current != last._M_current) {
    pTVar2 = *__first._M_current;
    TVar1 = pTVar2->type;
    if (TVar1 == OpenBracket) {
      auStack_68 = (undefined1  [8])0x0;
      n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      psVar9 = addNode<std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>
                         ((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                           *)auStack_88,(shared_ptr<chatra::Line> *)auStack_68,Unknown);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&n);
      lVar15 = 0;
      iVar8 = 0;
      for (last_00._M_current = __first._M_current + 1; last_00._M_current != last._M_current;
          last_00._M_current = last_00._M_current + 1) {
        if ((*last_00._M_current)->type == CloseBracket) {
          if (iVar8 == 0) break;
          iVar8 = iVar8 + -1;
        }
        else if ((*last_00._M_current)->type == OpenBracket) {
          iVar8 = iVar8 + 1;
        }
        lVar15 = lVar15 + -8;
      }
      peVar3 = (psVar9->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>::
      insert<__gnu_cxx::__normal_iterator<chatra::Token_const**,std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>>,void>
                ((vector<chatra::Token_const*,std::allocator<chatra::Token_const*>> *)
                 &peVar3->tokens,
                 (const_iterator)
                 (peVar3->tokens).
                 super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish,__first,
                 (__normal_iterator<const_chatra::Token_**,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
                  )(last_00._M_current + 1));
      peVar3 = (psVar9->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if (lVar15 == 0) {
        auStack_68 = (undefined1  [8])0x0;
        n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      }
      else {
        parseExpression<__gnu_cxx::__normal_iterator<chatra::Token_const**,std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>>>
                  ((chatra *)auStack_68,
                   (ParserContext *)
                   nodes.
                   super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (__normal_iterator<const_chatra::Token_**,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
                    )(__first._M_current + 1),last_00);
      }
      std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>::
      emplace_back<std::shared_ptr<chatra::Node>>
                ((vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>
                  *)&peVar3->subNodes,(shared_ptr<chatra::Node> *)auStack_68);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&n);
      __first._M_current = last_00._M_current + 1;
    }
    else {
      bVar7 = isLiteral(pTVar2);
      if (bVar7) {
        parseAsLiteral((chatra *)auStack_68,
                       (ParserContext *)
                       nodes.
                       super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,pTVar2);
        std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>::
        emplace_back<std::shared_ptr<chatra::Node>>
                  ((vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>
                    *)auStack_88,(shared_ptr<chatra::Node> *)auStack_68);
LAB_0018a785:
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&n);
        __first._M_current = __first._M_current + 1;
      }
      else {
        if (TVar1 == Operator) {
          auStack_68 = (undefined1  [8])0x0;
          n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          psVar9 = addNode<std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>
                             ((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                               *)auStack_88,(shared_ptr<chatra::Line> *)auStack_68,Unknown);
          std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>::push_back
                    (&((psVar9->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                      )->tokens,__first._M_current);
          goto LAB_0018a785;
        }
        if (TVar1 != Name) {
          std::__cxx11::string::string((string *)auStack_68,"expected expression",&local_31);
          local_a8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_a8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_a8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          ParserContext::errorAtToken
                    ((ParserContext *)
                     nodes.
                     super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,Error,pTVar2,
                     (string *)auStack_68,&local_a8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_a8);
          std::__cxx11::string::~string((string *)auStack_68);
          std::
          vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::
          clear((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                 *)auStack_88);
          break;
        }
        auStack_68 = (undefined1  [8])0x0;
        n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
        psVar9 = addNode<std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>
                           ((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                             *)auStack_88,(shared_ptr<chatra::Line> *)auStack_68,Name);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&n);
        peVar3 = (psVar9->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        peVar3->sid = (*__first._M_current)->sid;
        std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>::push_back
                  (&peVar3->tokens,__first._M_current);
        __first._M_current = __first._M_current + 1;
      }
    }
  }
  pcVar6 = DAT_0024f520;
  if (auStack_88 !=
      (undefined1  [8])
      nodes.
      super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    for (pcVar12 = opPatterns; pcVar12 != pcVar6; pcVar12 = pcVar12 + 0x20) {
      __last._M_current =
           nodes.
           super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      iVar10._M_current = (shared_ptr<chatra::Node> *)auStack_88;
      if (*pcVar12 == '\x01') {
        for (; iVar10._M_current !=
               nodes.
               super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
            iVar10._M_current =
                 (shared_ptr<chatra::Node> *)
                 ((long)&((iVar10._M_current)->
                         super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
                 (ulong)(((byte)~bVar14 & 1) << 4))) {
          pOVar4 = *(OperatorPattern **)(pcVar12 + 0x10);
          bVar14 = 0;
          for (pOVar13 = *(OperatorPattern **)(pcVar12 + 8); pOVar13 != pOVar4;
              pOVar13 = pOVar13 + 1) {
            if ((ulong)((long)(pOVar13->elements).
                              super__Vector_base<chatra::OperatorPatternElement,_std::allocator<chatra::OperatorPatternElement>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pOVar13->elements).
                             super__Vector_base<chatra::OperatorPatternElement,_std::allocator<chatra::OperatorPatternElement>_>
                             ._M_impl.super__Vector_impl_data._M_start) <=
                (ulong)((long)nodes.
                              super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                              ._M_impl.super__Vector_impl_data._M_start - (long)iVar10._M_current))
            {
              extractOperator<__gnu_cxx::__normal_iterator<std::shared_ptr<chatra::Node>*,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>>
                        ((chatra *)auStack_68,
                         (__normal_iterator<std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
                          )auStack_88,
                         (__normal_iterator<std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
                          )iVar10._M_current,pOVar13);
              if (auStack_68 != (undefined1  [8])0x0) {
                iVar10 = std::
                         vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                         ::erase((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                                  *)auStack_88,(const_iterator)iVar10._M_current,
                                 (shared_ptr<chatra::Node> *)
                                 (((long)(pOVar13->elements).
                                         super__Vector_base<chatra::OperatorPatternElement,_std::allocator<chatra::OperatorPatternElement>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(pOVar13->elements).
                                        super__Vector_base<chatra::OperatorPatternElement,_std::allocator<chatra::OperatorPatternElement>_>
                                        ._M_impl.super__Vector_impl_data._M_start) +
                                 (long)iVar10._M_current));
                iVar10 = std::
                         vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                         ::insert((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                                   *)auStack_88,(const_iterator)iVar10._M_current,
                                  (value_type *)auStack_68);
                bVar14 = 1;
              }
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&n);
            }
          }
        }
      }
      else {
        for (; (undefined1  [8])__last._M_current != auStack_88;
            __last._M_current =
                 (shared_ptr<chatra::Node> *)
                 ((long)&__last._M_current[-1].
                         super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                 (ulong)(uint)(iVar8 << 4))) {
          pOVar4 = *(OperatorPattern **)(pcVar12 + 0x10);
          iVar8 = 0;
          for (pOVar13 = *(OperatorPattern **)(pcVar12 + 8); pOVar13 != pOVar4;
              pOVar13 = pOVar13 + 1) {
            uVar11 = (long)(pOVar13->elements).
                           super__Vector_base<chatra::OperatorPatternElement,_std::allocator<chatra::OperatorPatternElement>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(pOVar13->elements).
                           super__Vector_base<chatra::OperatorPatternElement,_std::allocator<chatra::OperatorPatternElement>_>
                           ._M_impl.super__Vector_impl_data._M_start;
            if (uVar11 <= (ulong)((long)__last._M_current - (long)auStack_88)) {
              extractOperator<__gnu_cxx::__normal_iterator<std::shared_ptr<chatra::Node>*,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>>
                        ((chatra *)auStack_68,
                         (__normal_iterator<std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
                          )auStack_88,(shared_ptr<chatra::Node> *)((long)__last._M_current - uVar11)
                         ,pOVar13);
              if (auStack_68 != (undefined1  [8])0x0) {
                iVar10 = std::
                         vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                         ::erase((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                                  *)auStack_88,
                                 (shared_ptr<chatra::Node> *)
                                 (((long)(pOVar13->elements).
                                         super__Vector_base<chatra::OperatorPatternElement,_std::allocator<chatra::OperatorPatternElement>_>
                                         ._M_impl.super__Vector_impl_data._M_start -
                                  (long)(pOVar13->elements).
                                        super__Vector_base<chatra::OperatorPatternElement,_std::allocator<chatra::OperatorPatternElement>_>
                                        ._M_impl.super__Vector_impl_data._M_finish) +
                                 (long)__last._M_current),__last);
                iVar10 = std::
                         vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                         ::insert((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                                   *)auStack_88,(const_iterator)iVar10._M_current,
                                  (value_type *)auStack_68);
                __last._M_current = iVar10._M_current + 1;
                iVar8 = 1;
              }
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&n);
            }
          }
        }
      }
    }
    if ((auStack_88 ==
         (undefined1  [8])
         nodes.
         super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
         ._M_impl.super__Vector_impl_data._M_start) ||
       ((*(element_type **)auStack_88)->type == Unknown)) {
      pTVar2 = *first._M_current;
      std::__cxx11::string::string((string *)auStack_68,"expected expression",&local_31);
      local_a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ParserContext::errorAtToken
                ((ParserContext *)
                 nodes.
                 super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,Error,pTVar2,
                 (string *)auStack_68,&local_a8);
    }
    else {
      if ((long)nodes.
                super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                ._M_impl.super__Vector_impl_data._M_start - (long)auStack_88 == 0x10) {
        std::__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2> *)this,
                   (__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2> *)auStack_88);
        goto LAB_0018aa2d;
      }
      ppTVar5 = (((__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2> *)
                 ((long)auStack_88 + 0x10))->_M_ptr->tokens).
                super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (ppTVar5 ==
          (((__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2> *)((long)auStack_88 + 0x10))->
           _M_ptr->tokens).
          super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pTVar2 = *first._M_current;
        std::__cxx11::string::string
                  ((string *)auStack_68,"extra token in expression starts from this token",&local_31
                  );
        local_a8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_a8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_a8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        ParserContext::errorAtToken
                  ((ParserContext *)
                   nodes.
                   super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,Error,pTVar2,
                   (string *)auStack_68,&local_a8);
      }
      else {
        pTVar2 = *ppTVar5;
        std::__cxx11::string::string((string *)auStack_68,"extra token in expression",&local_31);
        local_a8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_a8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_a8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        ParserContext::errorAtToken
                  ((ParserContext *)
                   nodes.
                   super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,Error,pTVar2,
                   (string *)auStack_68,&local_a8);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_a8);
    std::__cxx11::string::~string((string *)auStack_68);
  }
  createNullNode(this,*first._M_current);
LAB_0018aa2d:
  std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::
  ~vector((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_> *)
          auStack_88);
  sVar16.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar16.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<chatra::Node>)
         sVar16.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static std::shared_ptr<Node> parseExpression(ParserContext& ct, TokenPtrIterator first, TokenPtrIterator last) {

	auto nodes = parseNodes(ct, first, last);
	if (nodes.empty())
		return createNullNode(**first);

	// Simple but may inefficient bottom-up parsing
	// TODO rewrite
	for (auto& group : opPatterns) {
		if (group.leftToRight) {
			for (auto it = nodes.begin(); it != nodes.end(); ) {
				bool matched = false;
				for (auto& pattern : group.patterns) {
					if (static_cast<size_t>(std::distance(it, nodes.end())) < pattern.elements.size())
						continue;
					auto n = extractOperator(nodes.begin(), it, pattern);
					if (!n)
						continue;
					it = nodes.erase(it, it + pattern.elements.size());
					it = nodes.insert(it, n);
					matched = true;
				}
				if (!matched)
					it++;
			}
		}
		else {
			for (auto it = nodes.end(); it != nodes.begin(); ) {
				bool matched = false;
				for (auto& pattern : group.patterns) {
					if (static_cast<size_t>(std::distance(nodes.begin(), it)) < pattern.elements.size())
						continue;
					auto n = extractOperator(nodes.begin(), it - pattern.elements.size(), pattern);
					if (!n)
						continue;
					it = nodes.erase(it - pattern.elements.size(), it);
					it = nodes.insert(it, n) + 1;
					matched = true;
				}
				if (!matched)
					it--;
			}
		}
	}

	if (nodes.empty() || nodes[0]->type == NodeType::Unknown) {
		ct.errorAtToken(ErrorLevel::Error, **first, "expected expression", {});
		return createNullNode(**first);
	}

	if (nodes.size() != 1) {
		if (!nodes[1]->tokens.empty())
			ct.errorAtToken(ErrorLevel::Error, *nodes[1]->tokens[0], "extra token in expression", {});
		else
			ct.errorAtToken(ErrorLevel::Error, **first, "extra token in expression starts from this token", {});
		return createNullNode(**first);
	}

	return nodes[0];
}